

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFileNamer.cpp
# Opt level: O1

string * __thiscall
ApprovalTests::ExistingFileNamer::getApprovedFile
          (string *__return_storage_ptr__,ExistingFileNamer *this,string *extensionWithDot)

{
  pointer pcVar1;
  long *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  ApprovalTests::Options::getNamer(this->options_);
  pcVar1 = (extensionWithDot->_M_dataplus)._M_p;
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + extensionWithDot->_M_string_length);
  (**(code **)(*local_50 + 0x10))(__return_storage_ptr__,local_50,local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExistingFileNamer::getApprovedFile(std::string extensionWithDot) const
    {
        return options_.getNamer()->getApprovedFile(extensionWithDot);
    }